

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O3

rb_tree_node_base *
nestl::impl::detail::rb_tree_rebalance_for_erase(rb_tree_node_base *z,rb_tree_node_base *header)

{
  base_ptr prVar1;
  base_ptr *pprVar2;
  base_ptr prVar3;
  rb_tree_node_base *prVar4;
  rb_tree_color rVar5;
  base_ptr prVar6;
  rb_tree_node_base *y_1;
  base_ptr prVar7;
  base_ptr *pprVar8;
  base_ptr prVar9;
  bool bVar10;
  
  pprVar2 = &header->m_parent;
  prVar6 = z->m_left;
  prVar1 = z->m_right;
  prVar4 = z;
  prVar3 = prVar1;
  if (prVar6 == (base_ptr)0x0) {
LAB_00108f56:
    prVar7 = prVar4->m_parent;
    if (prVar3 != (base_ptr)0x0) goto LAB_00108f62;
    bVar10 = true;
    prVar3 = (base_ptr)0x0;
  }
  else {
    if (prVar1 != (base_ptr)0x0) {
      do {
        prVar4 = prVar3;
        prVar3 = prVar4->m_left;
      } while (prVar4->m_left != (base_ptr)0x0);
      prVar3 = prVar4->m_right;
      if (prVar4 != z) {
        prVar6->m_parent = prVar4;
        prVar4->m_left = prVar6;
        prVar7 = prVar4;
        if (prVar4 != prVar1) {
          prVar7 = prVar4->m_parent;
          prVar6 = prVar7;
          if (prVar3 != (base_ptr)0x0) {
            prVar3->m_parent = prVar7;
            prVar6 = prVar4->m_parent;
          }
          prVar6->m_left = prVar3;
          prVar4->m_right = prVar1;
          z->m_right->m_parent = prVar4;
        }
        if (*pprVar2 == z) {
          *pprVar2 = prVar4;
          prVar6 = z->m_parent;
        }
        else {
          prVar6 = z->m_parent;
          if (prVar6->m_left == z) {
            prVar6->m_left = prVar4;
          }
          else {
            prVar6->m_right = prVar4;
          }
        }
        prVar4->m_parent = prVar6;
        rVar5 = prVar4->m_color;
        prVar4->m_color = z->m_color;
        z->m_color = rVar5;
        prVar4 = z;
        goto LAB_00109012;
      }
      goto LAB_00108f56;
    }
    prVar7 = z->m_parent;
    prVar3 = prVar6;
LAB_00108f62:
    prVar3->m_parent = prVar7;
    bVar10 = false;
  }
  pprVar8 = pprVar2;
  if (*pprVar2 != z) {
    prVar6 = z->m_parent;
    pprVar8 = &prVar6->m_right;
    if (prVar6->m_left == z) {
      pprVar8 = &prVar6->m_left;
    }
  }
  *pprVar8 = prVar3;
  if (header->m_left == z) {
    if (z->m_right == (base_ptr)0x0) {
      prVar6 = z->m_parent;
    }
    else {
      prVar1 = prVar3;
      if (bVar10) {
        __assert_fail("x",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/detail/red_black_tree.hpp"
                      ,0x2d,
                      "static base_ptr nestl::impl::detail::rb_tree_node_base::s_minimum(base_ptr)")
        ;
      }
      do {
        prVar6 = prVar1;
        prVar1 = prVar6->m_left;
      } while (prVar6->m_left != (base_ptr)0x0);
    }
    header->m_left = prVar6;
  }
  if (header->m_right == z) {
    if (z->m_left == (base_ptr)0x0) {
      prVar6 = z->m_parent;
    }
    else {
      prVar1 = prVar3;
      if (bVar10) {
        __assert_fail("x",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/detail/red_black_tree.hpp"
                      ,0x42,
                      "static base_ptr nestl::impl::detail::rb_tree_node_base::s_maximum(base_ptr)")
        ;
      }
      do {
        prVar6 = prVar1;
        prVar1 = prVar6->m_right;
      } while (prVar6->m_right != (base_ptr)0x0);
    }
    header->m_right = prVar6;
  }
  rVar5 = prVar4->m_color;
LAB_00109012:
  if (rVar5 != rb_red) {
    if (prVar3 == *pprVar2) {
LAB_001092e6:
      if (prVar3 == (base_ptr)0x0) {
        return prVar4;
      }
    }
    else {
      do {
        if ((prVar3 != (base_ptr)0x0) && (prVar3->m_color != rb_black)) break;
        prVar6 = prVar7->m_left;
        if (prVar3 == prVar6) {
          prVar6 = prVar7->m_right;
          if (prVar6->m_color == rb_red) {
            prVar6->m_color = rb_black;
            prVar7->m_color = rb_red;
            prVar1 = prVar6->m_left;
            prVar7->m_right = prVar1;
            if (prVar1 != (base_ptr)0x0) {
              prVar1->m_parent = prVar7;
            }
            prVar1 = prVar7->m_parent;
            prVar6->m_parent = prVar1;
            pprVar8 = pprVar2;
            if (*pprVar2 != prVar7) {
              pprVar8 = &prVar1->m_right;
              if (prVar1->m_left == prVar7) {
                pprVar8 = &prVar1->m_left;
              }
            }
            *pprVar8 = prVar6;
            prVar6->m_left = prVar7;
            prVar7->m_parent = prVar6;
            prVar6 = prVar7->m_right;
          }
          prVar1 = prVar6->m_left;
          if ((prVar1 == (base_ptr)0x0) || (prVar1->m_color == rb_black)) {
            prVar9 = prVar6->m_right;
            if ((prVar9 == (base_ptr)0x0) || (prVar9->m_color == rb_black)) goto LAB_0010913f;
LAB_0010929a:
            prVar6->m_color = prVar7->m_color;
            prVar7->m_color = rb_black;
LAB_001092a6:
            prVar9->m_color = rb_black;
          }
          else {
            prVar9 = prVar6->m_right;
            if ((prVar9 != (base_ptr)0x0) && (prVar9->m_color != rb_black)) goto LAB_0010929a;
            prVar1->m_color = rb_black;
            prVar6->m_color = rb_red;
            prVar9 = prVar1->m_right;
            prVar6->m_left = prVar9;
            if (prVar9 != (base_ptr)0x0) {
              prVar9->m_parent = prVar6;
            }
            prVar9 = prVar6->m_parent;
            prVar1->m_parent = prVar9;
            pprVar8 = pprVar2;
            if (*pprVar2 != prVar6) {
              pprVar8 = &prVar9->m_left;
              if (prVar9->m_right == prVar6) {
                pprVar8 = &prVar9->m_right;
              }
            }
            *pprVar8 = prVar1;
            prVar1->m_right = prVar6;
            prVar6->m_parent = prVar1;
            prVar6 = prVar7->m_right;
            prVar9 = prVar6->m_right;
            prVar6->m_color = prVar7->m_color;
            prVar7->m_color = rb_black;
            if (prVar9 != (base_ptr)0x0) goto LAB_001092a6;
          }
          prVar1 = prVar6->m_left;
          prVar7->m_right = prVar1;
          if (prVar1 != (base_ptr)0x0) {
            prVar1->m_parent = prVar7;
          }
          prVar1 = prVar7->m_parent;
          prVar6->m_parent = prVar1;
          if (*pprVar2 != prVar7) {
            pprVar2 = &prVar1->m_right;
            if (prVar1->m_left == prVar7) {
              pprVar2 = &prVar1->m_left;
            }
          }
          *pprVar2 = prVar6;
          prVar6->m_left = prVar7;
LAB_001092e2:
          prVar7->m_parent = prVar6;
          goto LAB_001092e6;
        }
        if (prVar6->m_color == rb_red) {
          prVar6->m_color = rb_black;
          prVar7->m_color = rb_red;
          prVar1 = prVar6->m_right;
          prVar7->m_left = prVar1;
          if (prVar1 != (base_ptr)0x0) {
            prVar1->m_parent = prVar7;
          }
          prVar1 = prVar7->m_parent;
          prVar6->m_parent = prVar1;
          pprVar8 = pprVar2;
          if (*pprVar2 != prVar7) {
            pprVar8 = &prVar1->m_left;
            if (prVar1->m_right == prVar7) {
              pprVar8 = &prVar1->m_right;
            }
          }
          *pprVar8 = prVar6;
          prVar6->m_right = prVar7;
          prVar7->m_parent = prVar6;
          prVar6 = prVar7->m_left;
        }
        prVar1 = prVar6->m_right;
        if ((prVar1 != (base_ptr)0x0) && (prVar1->m_color != rb_black)) {
          prVar9 = prVar6->m_left;
          if ((prVar9 != (base_ptr)0x0) && (prVar9->m_color != rb_black)) goto LAB_001091da;
          prVar1->m_color = rb_black;
          prVar6->m_color = rb_red;
          prVar9 = prVar1->m_left;
          prVar6->m_right = prVar9;
          if (prVar9 != (base_ptr)0x0) {
            prVar9->m_parent = prVar6;
          }
          prVar9 = prVar6->m_parent;
          prVar1->m_parent = prVar9;
          pprVar8 = pprVar2;
          if (*pprVar2 != prVar6) {
            pprVar8 = &prVar9->m_right;
            if (prVar9->m_left == prVar6) {
              pprVar8 = &prVar9->m_left;
            }
          }
          *pprVar8 = prVar1;
          prVar1->m_left = prVar6;
          prVar6->m_parent = prVar1;
          prVar6 = prVar7->m_left;
          prVar9 = prVar6->m_left;
          prVar6->m_color = prVar7->m_color;
          prVar7->m_color = rb_black;
          if (prVar9 != (base_ptr)0x0) goto LAB_001091e6;
LAB_001091ed:
          prVar1 = prVar6->m_right;
          prVar7->m_left = prVar1;
          if (prVar1 != (base_ptr)0x0) {
            prVar1->m_parent = prVar7;
          }
          prVar1 = prVar7->m_parent;
          prVar6->m_parent = prVar1;
          if (*pprVar2 != prVar7) {
            pprVar2 = &prVar1->m_left;
            if (prVar1->m_right == prVar7) {
              pprVar2 = &prVar1->m_right;
            }
          }
          *pprVar2 = prVar6;
          prVar6->m_right = prVar7;
          goto LAB_001092e2;
        }
        prVar9 = prVar6->m_left;
        if ((prVar9 != (base_ptr)0x0) && (prVar9->m_color != rb_black)) {
LAB_001091da:
          prVar6->m_color = prVar7->m_color;
          prVar7->m_color = rb_black;
LAB_001091e6:
          prVar9->m_color = rb_black;
          goto LAB_001091ed;
        }
LAB_0010913f:
        prVar6->m_color = rb_red;
        bVar10 = prVar7 != *pprVar2;
        prVar3 = prVar7;
        prVar7 = prVar7->m_parent;
      } while (bVar10);
    }
    prVar3->m_color = rb_black;
  }
  return prVar4;
}

Assistant:

inline rb_tree_node_base*
rb_tree_rebalance_for_erase(rb_tree_node_base* const z,
                            rb_tree_node_base& header) NESTL_NOEXCEPT_SPEC
{
    rb_tree_node_base *& root = header.m_parent;
    rb_tree_node_base *& leftmost = header.m_left;
    rb_tree_node_base *& rightmost = header.m_right;
    rb_tree_node_base* y = z;
    rb_tree_node_base* x = 0;
    rb_tree_node_base* x_parent = 0;

    if (y->m_left == 0)     // z has at most one non-null child. y == z.
        x = y->m_right;     // x might be null.
    else
        if (y->m_right == 0)  // z has exactly one non-null child. y == z.
            x = y->m_left;    // x is not null.
        else
        {
            // z has two non-null children.  Set y to
            y = y->m_right;   //   z's successor.  x might be null.
            while (y->m_left != 0)
                y = y->m_left;
            x = y->m_right;
        }
    if (y != z)
    {
        // relink y in place of z.  y is z's successor
        z->m_left->m_parent = y;
        y->m_left = z->m_left;
        if (y != z->m_right)
        {
            x_parent = y->m_parent;
            if (x) x->m_parent = y->m_parent;
            y->m_parent->m_left = x;   // y must be a child of m_left
            y->m_right = z->m_right;
            z->m_right->m_parent = y;
        }
        else
            x_parent = y;
        if (root == z)
            root = y;
        else if (z->m_parent->m_left == z)
            z->m_parent->m_left = y;
        else
            z->m_parent->m_right = y;
        y->m_parent = z->m_parent;
        std::swap(y->m_color, z->m_color);
        y = z;
        // y now points to node to be actually deleted
    }
    else
    {                        // y == z
        x_parent = y->m_parent;
        if (x)
            x->m_parent = y->m_parent;
        if (root == z)
            root = x;
        else
            if (z->m_parent->m_left == z)
                z->m_parent->m_left = x;
            else
                z->m_parent->m_right = x;
        if (leftmost == z)
        {
            if (z->m_right == 0)        // z->m_left must be null also
                leftmost = z->m_parent;
            // makes leftmost == _M_header if z == root
            else
                leftmost = rb_tree_node_base::s_minimum(x);
        }
        if (rightmost == z)
        {
            if (z->m_left == 0)         // z->m_right must be null also
                rightmost = z->m_parent;
            // makes rightmost == _M_header if z == root
            else                      // x == z->m_left
                rightmost = rb_tree_node_base::s_maximum(x);
        }
    }
    if (y->m_color != rb_red)
      {
    while (x != root && (x == 0 || x->m_color == rb_black))
      if (x == x_parent->m_left)
        {
          rb_tree_node_base* w = x_parent->m_right;
          if (w->m_color == rb_red)
        {
          w->m_color = rb_black;
          x_parent->m_color = rb_red;
          local_rb_tree_rotate_left(x_parent, root);
          w = x_parent->m_right;
        }
          if ((w->m_left == 0 ||
           w->m_left->m_color == rb_black) &&
          (w->m_right == 0 ||
           w->m_right->m_color == rb_black))
        {
          w->m_color = rb_red;
          x = x_parent;
          x_parent = x_parent->m_parent;
        }
          else
        {
          if (w->m_right == 0
              || w->m_right->m_color == rb_black)
            {
              w->m_left->m_color = rb_black;
              w->m_color = rb_red;
              local_rb_tree_rotate_right(w, root);
              w = x_parent->m_right;
            }
          w->m_color = x_parent->m_color;
          x_parent->m_color = rb_black;
          if (w->m_right)
            w->m_right->m_color = rb_black;
          local_rb_tree_rotate_left(x_parent, root);
          break;
        }
        }
      else
        {
          // same as above, with m_right <-> m_left.
          rb_tree_node_base* w = x_parent->m_left;
          if (w->m_color == rb_red)
        {
          w->m_color = rb_black;
          x_parent->m_color = rb_red;
          local_rb_tree_rotate_right(x_parent, root);
          w = x_parent->m_left;
        }
          if ((w->m_right == 0 ||
           w->m_right->m_color == rb_black) &&
          (w->m_left == 0 ||
           w->m_left->m_color == rb_black))
        {
          w->m_color = rb_red;
          x = x_parent;
          x_parent = x_parent->m_parent;
        }
          else
        {
          if (w->m_left == 0 || w->m_left->m_color == rb_black)
            {
              w->m_right->m_color = rb_black;
              w->m_color = rb_red;
              local_rb_tree_rotate_left(w, root);
              w = x_parent->m_left;
            }
          w->m_color = x_parent->m_color;
          x_parent->m_color = rb_black;
          if (w->m_left)
            w->m_left->m_color = rb_black;
          local_rb_tree_rotate_right(x_parent, root);
          break;
        }
        }
    if (x) x->m_color = rb_black;
      }
    return y;
  }